

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O3

ARKodeSPRKTable ARKodeSPRKTable_Load(ARKODE_SPRKMethodID id)

{
  ARKodeSPRKTable pAVar1;
  
  switch(id) {
  case ARKODE_MIN_SPRK_NUM:
    pAVar1 = ARKodeSPRKTable_Alloc(1);
    if (pAVar1 != (ARKodeSPRKTable)0x0) {
      pAVar1->q = 1;
      pAVar1->stages = 1;
      *pAVar1->a = 1.0;
      *pAVar1->ahat = 1.0;
      return pAVar1;
    }
    break;
  case ARKODE_SPRK_LEAPFROG_2_2:
    pAVar1 = arkodeSymplecticLeapfrog2();
    return pAVar1;
  case ARKODE_SPRK_PSEUDO_LEAPFROG_2_2:
    pAVar1 = arkodeSymplecticPseudoLeapfrog2();
    return pAVar1;
  case ARKODE_SPRK_RUTH_3_3:
    pAVar1 = arkodeSymplecticRuth3();
    return pAVar1;
  case ARKODE_SPRK_MCLACHLAN_2_2:
    pAVar1 = arkodeSymplecticMcLachlan2();
    return pAVar1;
  case ARKODE_SPRK_MCLACHLAN_3_3:
    pAVar1 = arkodeSymplecticMcLachlan3();
    return pAVar1;
  case ARKODE_SPRK_CANDY_ROZMUS_4_4:
    pAVar1 = arkodeSymplecticCandyRozmus4();
    return pAVar1;
  case ARKODE_SPRK_MCLACHLAN_4_4:
    pAVar1 = arkodeSymplecticMcLachlan4();
    return pAVar1;
  case ARKODE_SPRK_MCLACHLAN_5_6:
    pAVar1 = arkodeSymplecticMcLachlan5();
    return pAVar1;
  case ARKODE_SPRK_YOSHIDA_6_8:
    pAVar1 = arkodeSymplecticYoshida6();
    return pAVar1;
  case ARKODE_SPRK_SUZUKI_UMENO_8_16:
    pAVar1 = arkodeSymplecticSuzukiUmeno816();
    return pAVar1;
  case ARKODE_MAX_SPRK_NUM:
    pAVar1 = arkodeSymplecticSofroniou10();
    return pAVar1;
  }
  return (ARKodeSPRKTable)0x0;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Load(ARKODE_SPRKMethodID id)
{
  switch (id)
  {
  case ARKODE_SPRK_EULER_1_1: return arkodeSymplecticEuler();
  case ARKODE_SPRK_LEAPFROG_2_2: return arkodeSymplecticLeapfrog2();
  case ARKODE_SPRK_PSEUDO_LEAPFROG_2_2:
    return arkodeSymplecticPseudoLeapfrog2();
  case ARKODE_SPRK_RUTH_3_3: return arkodeSymplecticRuth3();
  case ARKODE_SPRK_MCLACHLAN_2_2: return arkodeSymplecticMcLachlan2();
  case ARKODE_SPRK_MCLACHLAN_3_3: return arkodeSymplecticMcLachlan3();
  case ARKODE_SPRK_MCLACHLAN_4_4: return arkodeSymplecticMcLachlan4();
  case ARKODE_SPRK_CANDY_ROZMUS_4_4: return arkodeSymplecticCandyRozmus4();
  case ARKODE_SPRK_MCLACHLAN_5_6: return arkodeSymplecticMcLachlan5();
  case ARKODE_SPRK_YOSHIDA_6_8: return arkodeSymplecticYoshida6();
  case ARKODE_SPRK_SUZUKI_UMENO_8_16: return arkodeSymplecticSuzukiUmeno816();
  case ARKODE_SPRK_SOFRONIOU_10_36: return arkodeSymplecticSofroniou10();
  default: return NULL;
  }
}